

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-cpp.cpp
# Opt level: O3

void test_xml_parse_document_3(void)

{
  bool condition;
  FILE *source;
  xml_document *document;
  xml_node *pxVar1;
  xml_string *a;
  int in_R8D;
  
  source = fopen("test.xml","rb");
  _assert_that(source != (FILE *)0x0,"Cannot open test.xml","test_xml_parse_document_3",(char *)0xca
               ,in_R8D);
  document = xml_open_document((FILE *)source);
  _assert_that(document != (xml_document *)0x0,"Cannot parse test.xml","test_xml_parse_document_3",
               (char *)0xcc,in_R8D);
  pxVar1 = xml_document_root(document);
  pxVar1 = xml_easy_child(pxVar1,(uint8_t *)"Element","With",0);
  _assert_that(pxVar1 != (xml_node *)0x0,"Cannot find Document/Element/With",
               "test_xml_parse_document_3",(char *)0xcf,in_R8D);
  a = xml_node_content(pxVar1);
  condition = string_equals(a,"Child");
  _assert_that(condition,"Content of Document/Element/With must be `Child\'",
               "test_xml_parse_document_3",(char *)0xd1,in_R8D);
  xml_document_free(document,true);
  return;
}

Assistant:

static void test_xml_parse_document_3() {
	#define FILE_NAME "test.xml"
	FILE* handle = fopen(FILE_NAME, "rb");
	assert_that(handle, "Cannot open " FILE_NAME);
	struct xml_document* document = xml_open_document(handle);
	assert_that(document, "Cannot parse " FILE_NAME);
	struct xml_node* element = xml_easy_child(xml_document_root(document),
	  (uint8_t *)"Element", (uint8_t *)"With", 0);
	assert_that(element, "Cannot find Document/Element/With");
	assert_that(string_equals(xml_node_content(element), "Child"),
	  "Content of Document/Element/With must be `Child'");
	xml_document_free(document, true);
	#undef FILE_NAME
}